

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyInferredTag(TidyDocImpl *doc,TidyTagId id)

{
  Lexer *lexer;
  uint uVar1;
  Node *pNVar2;
  Dict *pDVar3;
  tmbstr ptVar4;
  
  lexer = doc->lexer;
  pNVar2 = prvTidyNewNode(lexer->allocator,lexer);
  pDVar3 = prvTidyLookupTagDef(id);
  if (pDVar3 != (Dict *)0x0) {
    pNVar2->type = StartTag;
    pNVar2->implicit = yes;
    ptVar4 = prvTidytmbstrdup(doc->allocator,pDVar3->name);
    pNVar2->element = ptVar4;
    pNVar2->tag = pDVar3;
    uVar1 = lexer->txtend;
    pNVar2->start = lexer->txtstart;
    pNVar2->end = uVar1;
    return pNVar2;
  }
  __assert_fail("dict != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/lexer.c",
                0x883,"Node *prvTidyInferredTag(TidyDocImpl *, TidyTagId)");
}

Assistant:

Node* TY_(InferredTag)(TidyDocImpl* doc, TidyTagId id)
{
    Lexer *lexer = doc->lexer;
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    const Dict* dict = TY_(LookupTagDef)(id);

    assert( dict != NULL );

    node->type = StartTag;
    node->implicit = yes;
    node->element = TY_(tmbstrdup)(doc->allocator, dict->name);
    node->tag = dict;
    node->start = lexer->txtstart;
    node->end = lexer->txtend;

    return node;
}